

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_mvzs(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 val;
  uint opsize;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  opsize = insn >> 6 & 1;
  val = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,opsize,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,
                    (-1 < (char)insn) + EA_LOADU,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (val != tcg_ctx->NULL_QREG) {
    pTVar1 = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(insn >> 6 & 0x38));
    if (pTVar1 != val) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(pTVar1 + (long)tcg_ctx),
                       (TCGArg)(val + (long)tcg_ctx));
    }
    gen_logic_cc(s,val,opsize);
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(mvzs)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    TCGv src;
    TCGv reg;

    if (insn & 0x40)
        opsize = OS_WORD;
    else
        opsize = OS_BYTE;
    SRC_EA(env, src, opsize, (insn & 0x80) == 0, NULL);
    reg = DREG(insn, 9);
    tcg_gen_mov_i32(tcg_ctx, reg, src);
    gen_logic_cc(s, src, opsize);
}